

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall
testing::internal::Arguments::AddArguments<testing::internal::String>
          (Arguments *this,
          vector<testing::internal::String,_std::allocator<testing::internal::String>_> *arguments)

{
  pointer ppcVar1;
  pointer pSVar2;
  char *local_30;
  
  for (pSVar2 = (arguments->
                super__Vector_base<testing::internal::String,_std::allocator<testing::internal::String>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar2 != (arguments->
                super__Vector_base<testing::internal::String,_std::allocator<testing::internal::String>_>
                )._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    ppcVar1 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_30 = strdup(pSVar2->c_str_);
    std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
              (&this->args_,(const_iterator)(ppcVar1 + -1),&local_30);
  }
  return;
}

Assistant:

void AddArguments(const ::std::vector<Str>& arguments) {
    for (typename ::std::vector<Str>::const_iterator i = arguments.begin();
         i != arguments.end();
         ++i) {
      args_.insert(args_.end() - 1, posix::StrDup(i->c_str()));
    }
  }